

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_shield_cleave(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *ch_00;
  CClass *this;
  OBJ_DATA *pOVar5;
  OBJ_DATA *pOVar6;
  char *pcVar7;
  long lVar8;
  char arg [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_2438);
  if (local_2438[0] == '\0') {
    ch_00 = ch->fighting;
  }
  else {
    ch_00 = get_char_room(ch,local_2438);
  }
  iVar3 = get_skill(ch,(int)gsn_shield_cleave);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar8 = (long)gsn_shield_cleave;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar8 * 0x60 + 0x45a788 + (long)iVar4 * 2) <= sVar1) {
      pOVar5 = get_eq_char(ch,0x10);
      pOVar6 = pOVar5;
      if (pOVar5 == (OBJ_DATA *)0x0) {
        pOVar6 = get_eq_char(ch,0x12);
      }
      if ((pOVar6 == (OBJ_DATA *)0x0) || ((pOVar6->value[0] | 4U) != 5)) {
        pcVar7 = "You must be wielding an axe or sword to shield cleave.\n\r";
      }
      else if (ch_00 == (CHAR_DATA *)0x0) {
        pcVar7 = "But they aren\'t here.\n\r";
      }
      else if (ch_00 == ch) {
        pcVar7 = "That isn\'t possible.\n\r";
      }
      else {
        pOVar6 = get_eq_char(ch_00,0xb);
        if (pOVar6 != (OBJ_DATA *)0x0) {
          iVar4 = (iVar3 * 9) / 10 - (int)pOVar6->level;
          iVar3 = iVar4 + -0xf;
          if (pOVar5 != (OBJ_DATA *)0x0) {
            iVar3 = iVar4;
          }
          iVar3 = iVar3 + ((int)ch->level - (int)ch_00->level) * 3;
          bVar2 = is_npc(ch_00);
          if ((!bVar2) && (ch->fighting != ch_00)) {
            pcVar7 = pers(ch,ch_00);
            sprintf(local_1238,"Help! %s just shield cleaved me!",pcVar7);
            do_myell(ch_00,local_1238,ch);
          }
          bVar2 = is_obj_stat(pOVar6,0x12);
          if (bVar2) {
            iVar3 = 0;
          }
          iVar4 = number_percent();
          if (iVar3 < iVar4) {
            act("$n makes a might blow at $N\'s shield but fails to cleave it.",ch,(void *)0x0,ch_00
                ,1);
            act("$n lands a mighty blow to your shield but fails to cleave it.",ch,(void *)0x0,ch_00
                ,2);
            act("You strike a mighty blow to $N\'s shield but fail to cleave it.",ch,(void *)0x0,
                ch_00,3);
            check_improve(ch,(int)gsn_shield_cleave,false,1);
            WAIT_STATE(ch,0xc);
          }
          else {
            act("$n\'s mighty blow cleaves $N\'s shield in half!",ch,(void *)0x0,ch_00,1);
            act("Your mighty blow cleaves $N\'s shield in half!",ch,(void *)0x0,ch_00,3);
            act("$n strikes your shield with powerful force, cleaving it in two!",ch,(void *)0x0,
                ch_00,2);
            extract_obj(pOVar6);
            WAIT_STATE(ch,0xc);
            check_improve(ch,(int)gsn_shield_cleave,true,1);
          }
          multi_hit(ch_00,ch,-1);
          return;
        }
        pcVar7 = "But they aren\'t using a shield.\n\r";
      }
      goto LAB_0029e4a1;
    }
  }
  pcVar7 = "You don\'t know the methods to cleave a shield in two.\n\r";
LAB_0029e4a1:
  send_to_char(pcVar7,ch);
  return;
}

Assistant:

void do_shield_cleave(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	int chance;
	OBJ_DATA *weapon;
	OBJ_DATA *shield;
	bool using_primary = true;
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	chance = get_skill(ch, gsn_shield_cleave);

	if (chance == 0 || ch->level < skill_table[gsn_shield_cleave].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know the methods to cleave a shield in two.\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr)
	{
		weapon = get_eq_char(ch, WEAR_DUAL_WIELD);
		using_primary = false;
	}

	if (weapon == nullptr || (weapon->value[0] != WEAPON_SWORD && weapon->value[0] != WEAPON_AXE))
	{
		send_to_char("You must be wielding an axe or sword to shield cleave.\n\r", ch);
		return;
	}

	if (victim == nullptr)
	{
		send_to_char("But they aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That isn't possible.\n\r", ch);
		return;
	}

	shield = get_eq_char(victim, WEAR_SHIELD);

	if (shield == nullptr)
	{
		send_to_char("But they aren't using a shield.\n\r", ch);
		return;
	}

	chance *= 9;
	chance /= 10;
	chance += (ch->level - victim->level) * 3;
	chance -= shield->level;

	if (!using_primary)
		chance -= 15;

	if (!is_npc(victim) && ch->fighting != victim)
	{
		sprintf(buf, "Help! %s just shield cleaved me!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (is_obj_stat(shield, ITEM_NODISARM))
		chance = 0;

	if (number_percent() > chance)
	{
		act("$n makes a might blow at $N's shield but fails to cleave it.", ch, 0, victim, TO_NOTVICT);
		act("$n lands a mighty blow to your shield but fails to cleave it.", ch, 0, victim, TO_VICT);
		act("You strike a mighty blow to $N's shield but fail to cleave it.", ch, 0, victim, TO_CHAR);
		check_improve(ch, gsn_shield_cleave, false, 1);

		WAIT_STATE(ch, 12);
		multi_hit(victim, ch, -1);
		return;
	}

	act("$n's mighty blow cleaves $N's shield in half!", ch, 0, victim, TO_NOTVICT);
	act("Your mighty blow cleaves $N's shield in half!", ch, 0, victim, TO_CHAR);
	act("$n strikes your shield with powerful force, cleaving it in two!", ch, 0, victim, TO_VICT);
	extract_obj(shield);

	WAIT_STATE(ch, 12);

	check_improve(ch, gsn_shield_cleave, true, 1);
	multi_hit(victim, ch, -1);
}